

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

bool __thiscall buffer::push_data(buffer *this,iovec *iov,int cnt,int ignore)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t *psVar6;
  
  if (cnt < 1) {
    bVar1 = true;
  }
  else {
    psVar6 = &iov->iov_len;
    iVar4 = 1;
    bVar1 = false;
    iVar5 = 0;
    do {
      iVar3 = (int)*psVar6;
      if (iVar3 - ignore != 0 && ignore <= iVar3) {
        bVar2 = push_data(this,(char *)((long)ignore + (long)((iovec *)(psVar6 + -1))->iov_base),
                          iVar3 - ignore);
        if (!bVar2) {
          this->end_ = this->end_ + -(long)iVar5;
          return bVar1;
        }
        iVar3 = (int)*psVar6;
        iVar5 = (iVar5 - ignore) + iVar3;
      }
      ignore = ignore - iVar3;
      if (ignore < 1) {
        ignore = 0;
      }
      bVar1 = cnt <= iVar4;
      iVar3 = (1 - cnt) + iVar4;
      iVar4 = iVar4 + 1;
      psVar6 = psVar6 + 2;
    } while (iVar3 != 1);
  }
  return bVar1;
}

Assistant:

bool buffer::push_data(iovec *iov, int cnt, int ignore)
{
    int pushed = 0;
    for (int i = 0; i < cnt; i++, iov++)
    {
        if (ignore < (int)iov->iov_len)
        {
            if (!push_data((char*)iov->iov_base + ignore, iov->iov_len - ignore))
            {
                end_ -= pushed;
                return false;
            }
            pushed += iov->iov_len - ignore;
        }
        ignore = std::max<int>(0, ignore - iov->iov_len);
    }
    return true;
}